

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void pop_macro_call(c2m_ctx_t c2m_ctx)

{
  short sVar1;
  ushort uVar2;
  VARR_macro_call_t *pVVar3;
  MIR_context_t pMVar4;
  MIR_error_func_t p_Var5;
  token_t *pptVar6;
  uint *puVar7;
  VARR_token_t *pVVar8;
  pre_ctx *ppVar9;
  macro_t pmVar10;
  size_t sVar11;
  ulong uVar12;
  token_arr_t pVVar13;
  token_t *pptVar14;
  VARR_char *pVVar15;
  VARR_char *pVVar16;
  pos_t pVar17;
  gen_ctx **ppgVar18;
  char cVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  c2m_ctx_t pcVar25;
  MIR_context_t pMVar26;
  token_t ptVar27;
  token_t t;
  macro_call_t pmVar28;
  VARR_token_arr_t *pVVar29;
  token_arr_t *ppVVar30;
  gen_ctx *pgVar31;
  MIR_item_t pMVar32;
  c2m_ctx_t pcVar33;
  ulong uVar34;
  macro_call_t *ppmVar35;
  undefined1 *puVar36;
  ulong uVar37;
  char *pcVar38;
  char *pcVar39;
  node_t_conflict pnVar40;
  undefined4 *puVar41;
  long *plVar42;
  undefined8 *puVar43;
  void *pvVar44;
  uint uVar45;
  c2m_ctx_t pcVar46;
  uint uVar47;
  token_t t_00;
  char *format;
  long extraout_RDX;
  uint uVar48;
  c2m_ctx_t in_RSI;
  c2m_ctx_t pcVar49;
  MIR_item_t pMVar50;
  c2m_ctx_t pcVar51;
  char *pcVar52;
  char **in_R8;
  token_t t_01;
  MIR_context_t pMVar53;
  size_t sVar54;
  c2m_ctx_t pcVar55;
  MIR_context_t pMVar56;
  size_t sVar57;
  char *pcVar58;
  bool bVar59;
  str_t sVar60;
  char *pcStack_178;
  size_t sStack_170;
  MIR_context_t pMStack_e0;
  uint uStack_6c;
  
  pVVar3 = c2m_ctx->pre_ctx->macro_call_stack;
  if (((pVVar3 != (VARR_macro_call_t *)0x0) && (pVVar3->varr != (macro_call_t *)0x0)) &&
     (sVar54 = pVVar3->els_num, sVar54 != 0)) {
    pVVar3->els_num = sVar54 - 1;
    pmVar28 = pVVar3->varr[sVar54 - 1];
    pmVar28->macro->ignore_p = 0;
    free_macro_call(pmVar28);
    return;
  }
  pop_macro_call_cold_1();
  pMVar4 = in_RSI->ctx;
  pcVar52 = (char *)pMVar4->error_func;
  pcVar33 = in_RSI;
  pcVar49 = c2m_ctx;
  if ((MIR_context_t)pcVar52 != (MIR_context_t)0x0) {
    iVar23 = *(int *)&((MIR_context_t)pcVar52)->gen_ctx;
    iVar20 = *(int *)(in_RSI->env[0].__jmpbuf + 2);
    if (iVar20 < iVar23) {
      p_Var5 = ((MIR_context_t)pcVar52)->error_func;
      uStack_6c = 0xffffffff;
      do {
        pcVar52 = (char *)(ulong)(iVar20 + 1U);
        *(uint *)(in_RSI->env[0].__jmpbuf + 2) = iVar20 + 1U;
        pcVar25 = *(c2m_ctx_t *)(p_Var5 + (long)iVar20 * 8);
        sVar1 = *(short *)&pcVar25->ctx;
        if (sVar1 == 0x103) {
          pcVar49 = (c2m_ctx_t)pMVar4->c2mir_ctx;
          pcVar51 = (c2m_ctx_t)pcVar25->env[0].__jmpbuf[3];
          uVar21 = find_param((VARR_token_t *)pcVar49,(char *)pcVar51);
          if ((int)uVar21 < 0) {
            bVar59 = false;
            goto LAB_00193440;
          }
          pcVar52 = (char *)in_RSI->env[0].__jmpbuf[1];
          if ((((MIR_context_t)pcVar52 == (MIR_context_t)0x0) ||
              (((MIR_context_t)pcVar52)->error_func == (MIR_error_func_t)0x0)) ||
             (((MIR_context_t)pcVar52)->gen_ctx <= (gen_ctx *)(ulong)uVar21)) {
LAB_001935ae:
            process_replacement_cold_19();
LAB_001935b3:
            process_replacement_cold_9();
LAB_001935b8:
            process_replacement_cold_10();
LAB_001935bd:
            process_replacement_cold_3();
LAB_001935c2:
            process_replacement_cold_7();
LAB_001935c7:
            process_replacement_cold_12();
LAB_001935cc:
            process_replacement_cold_2();
LAB_001935d1:
            process_replacement_cold_8();
            pcVar33 = pcVar51;
            goto LAB_001935d6;
          }
          pcVar51 = *(c2m_ctx_t *)(((MIR_context_t)pcVar52)->error_func + (long)(ulong)uVar21 * 8);
          if (-1 < (int)uStack_6c) {
            pcVar33 = (c2m_ctx_t)(ulong)uStack_6c;
            del_tokens((VARR_token_t *)in_RSI->env[0].__jmpbuf[3],uStack_6c,-1);
            pcVar49 = pcVar51;
            if (pcVar51 == (c2m_ctx_t)0x0) goto LAB_001935f4;
            if (pcVar51->ctx != (MIR_context_t)0x0) {
              pptVar6 = (token_t *)pcVar51->env[0].__jmpbuf[0];
              if (pptVar6 == (token_t *)0x0) goto LAB_001935fe;
              sVar1 = *(short *)*pptVar6;
              if ((sVar1 == 0x20) || (sVar1 == 10)) {
                pcVar33 = (c2m_ctx_t)0x0;
                del_tokens((VARR_token_t *)pcVar51,0,1);
              }
            }
            pMVar26 = pcVar51->ctx;
            if (pMVar26 != (MIR_context_t)0x0) {
              pcVar52 = (char *)pcVar51->env[0].__jmpbuf[0];
              if ((MIR_context_t)pcVar52 == (MIR_context_t)0x0) goto LAB_00193603;
              uVar2 = **(ushort **)((long)pcVar52 + (long)pMVar26 * 8 + -8);
              pcVar52 = (char *)(ulong)uVar2;
              if ((uVar2 == 0x20) || (uVar2 == 10)) {
                pcVar51->ctx = (MIR_context_t)((long)&pMVar26[-1].wrapper_end_addr + 7);
              }
            }
            if (pcVar51->ctx == (MIR_context_t)0x0) {
              pMVar26 = in_RSI->ctx;
            }
            else {
              pMVar26 = (MIR_context_t)pcVar51->env[0].__jmpbuf[0];
              if (pMVar26 == (MIR_context_t)0x0) goto LAB_00193608;
            }
            pgVar31 = pMVar26->gen_ctx;
            pcVar52 = (c2m_ctx->empty_str).s;
            sVar54 = (c2m_ctx->empty_str).len;
            pVar17 = *(pos_t *)&pgVar31->optimize_level;
            pnVar40 = new_node(c2m_ctx,N_STR);
            add_pos(c2m_ctx,pnVar40,pVar17);
            (pnVar40->u).s.s = pcVar52;
            (pnVar40->u).s.len = sVar54;
            pcVar52 = ((pos_t *)&pgVar31->optimize_level)->fname;
            pMVar50 = pgVar31->curr_func_item;
            sVar60 = uniq_cstr(c2m_ctx,"");
            pcVar58 = sVar60.s;
            pcVar33 = (c2m_ctx_t)0x30;
            pcVar49 = c2m_ctx;
            pcVar25 = (c2m_ctx_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)&pcVar25->ctx = 0x102;
            ((pos_t *)&pcVar25->options)->fname = pcVar52;
            pcVar25->env[0].__jmpbuf[0] = (long)pMVar50;
            pcVar25->env[0].__jmpbuf[3] = (long)pcVar58;
            *(undefined4 *)(pcVar25->env[0].__jmpbuf + 1) = 0;
            pcVar25->env[0].__jmpbuf[2] = (long)pnVar40;
            pcVar52 = (char *)c2m_ctx->temp_string;
            if (((MIR_context_t)pcVar52 != (MIR_context_t)0x0) &&
               (((MIR_context_t)pcVar52)->error_func != (MIR_error_func_t)0x0)) {
              ((MIR_context_t)pcVar52)->gen_ctx = (gen_ctx *)0x0;
              cVar19 = *pcVar58;
              while (cVar19 != '\0') {
                pcVar58 = pcVar58 + 1;
                pVVar15 = c2m_ctx->temp_string;
                pcVar49 = (c2m_ctx_t)pVVar15->varr;
                if (pcVar49 == (c2m_ctx_t)0x0) goto LAB_001935c2;
                uVar37 = pVVar15->els_num + 1;
                if (pVVar15->size < uVar37) {
                  sVar57 = (uVar37 >> 1) + uVar37;
                  pcVar52 = (char *)realloc(pcVar49,sVar57);
                  pVVar15->varr = pcVar52;
                  pVVar15->size = sVar57;
                }
                sVar54 = pVVar15->els_num;
                pcVar52 = pVVar15->varr;
                pVVar15->els_num = sVar54 + 1;
                *(char *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) = cVar19;
                cVar19 = *pcVar58;
              }
              pVVar15 = c2m_ctx->temp_string;
              pcVar49 = (c2m_ctx_t)pVVar15->varr;
              if (pcVar49 != (c2m_ctx_t)0x0) {
                uVar37 = pVVar15->els_num + 1;
                if (pVVar15->size < uVar37) {
                  sVar57 = (uVar37 >> 1) + uVar37;
                  pcVar52 = (char *)realloc(pcVar49,sVar57);
                  pVVar15->varr = pcVar52;
                  pVVar15->size = sVar57;
                }
                sVar54 = pVVar15->els_num;
                pcVar52 = pVVar15->varr;
                pVVar15->els_num = sVar54 + 1;
                *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) = 0x22;
                if (pcVar51->ctx != (MIR_context_t)0x0) {
                  pMVar26 = (MIR_context_t)0x0;
                  do {
                    pptVar6 = (token_t *)pcVar51->env[0].__jmpbuf[0];
                    if (pptVar6 == (token_t *)0x0) goto LAB_001935c7;
                    ptVar27 = pptVar6[(long)pMVar26];
                    uVar2 = *(ushort *)ptVar27;
                    pcVar52 = (char *)(ulong)uVar2;
                    if ((uVar2 == 0x20) || (uVar2 == 10)) {
                      pVVar15 = c2m_ctx->temp_string;
                      pcVar49 = (c2m_ctx_t)pVVar15->varr;
                      if (pcVar49 == (c2m_ctx_t)0x0) goto LAB_001935d1;
                      uVar37 = pVVar15->els_num + 1;
                      if (pVVar15->size < uVar37) {
                        sVar57 = (uVar37 >> 1) + uVar37;
                        pcVar52 = (char *)realloc(pcVar49,sVar57);
                        pVVar15->varr = pcVar52;
                        pVVar15->size = sVar57;
                      }
                      sVar54 = pVVar15->els_num;
                      pcVar52 = pVVar15->varr;
                      pVVar15->els_num = sVar54 + 1;
                      *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) = 0x20;
                    }
                    else {
                      pcVar58 = ptVar27->repr;
                      cVar19 = *pcVar58;
                      if (cVar19 != '\0') {
                        pMVar56 = (MIR_context_t)((long)&pMVar26->gen_ctx + 1);
                        do {
                          pcVar52 = (char *)0x0;
                          if (pcVar51->ctx != pMVar56) {
                            if ((pcVar51->ctx <= pMVar56) ||
                               (pcVar52 = (char *)pcVar51->env[0].__jmpbuf[0],
                               (MIR_context_t)pcVar52 == (MIR_context_t)0x0)) goto LAB_001935b3;
                            pcVar52 = (char *)(ulong)(uint)(int)**(char **)((&((MIR_context_t)
                                                                              pcVar52)->c2mir_ctx)
                                                                            [(long)pMVar26] + 0x28);
                          }
                          if (cVar19 == '\"') {
LAB_00193278:
                            pVVar15 = c2m_ctx->temp_string;
                            pcVar49 = (c2m_ctx_t)pVVar15->varr;
                            if (pcVar49 == (c2m_ctx_t)0x0) goto LAB_001935b8;
                            uVar37 = pVVar15->els_num + 1;
                            if (pVVar15->size < uVar37) {
                              sVar57 = (uVar37 >> 1) + uVar37;
                              pcVar52 = (char *)realloc(pcVar49,sVar57);
                              pVVar15->varr = pcVar52;
                              pVVar15->size = sVar57;
                            }
                            sVar54 = pVVar15->els_num;
                            pcVar52 = pVVar15->varr;
                            pVVar15->els_num = sVar54 + 1;
                            *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) =
                                 0x5c;
                          }
                          else if (cVar19 == '\\') {
                            uVar21 = (uint)pcVar52;
                            if (((0x37 < uVar21 - 0x3f) ||
                                ((0xa880cc20000001U >> ((ulong)(uVar21 - 0x3f) & 0x3f) & 1) == 0))
                               && (bVar59 = (uVar21 & 0xfffffff8) == 0x30,
                                  uVar21 = uVar21 & 0xffffffdf,
                                  pcVar52 = (char *)(ulong)CONCAT31((int3)(uVar21 >> 8),
                                                                    uVar21 == 0x58 || bVar59),
                                  uVar21 != 0x58 && !bVar59)) goto LAB_00193278;
                          }
                          pVVar15 = c2m_ctx->temp_string;
                          pcVar49 = (c2m_ctx_t)pVVar15->varr;
                          if (pcVar49 == (c2m_ctx_t)0x0) {
                            process_replacement_cold_11();
                            goto LAB_001935ae;
                          }
                          cVar19 = *pcVar58;
                          uVar37 = pVVar15->els_num + 1;
                          if (pVVar15->size < uVar37) {
                            sVar57 = (uVar37 >> 1) + uVar37;
                            pcVar52 = (char *)realloc(pcVar49,sVar57);
                            pVVar15->varr = pcVar52;
                            pVVar15->size = sVar57;
                          }
                          sVar54 = pVVar15->els_num;
                          pcVar52 = pVVar15->varr;
                          pVVar15->els_num = sVar54 + 1;
                          *(char *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) = cVar19;
                          cVar19 = pcVar58[1];
                          pcVar58 = pcVar58 + 1;
                        } while (cVar19 != '\0');
                      }
                    }
                    pMVar26 = (MIR_context_t)((long)&pMVar26->gen_ctx + 1);
                  } while (pMVar26 < pcVar51->ctx);
                }
                pVVar15 = c2m_ctx->temp_string;
                pcVar49 = (c2m_ctx_t)pVVar15->varr;
                if (pcVar49 != (c2m_ctx_t)0x0) {
                  uVar37 = pVVar15->els_num + 1;
                  if (pVVar15->size < uVar37) {
                    pcVar33 = (c2m_ctx_t)((uVar37 >> 1) + uVar37);
                    pcVar51 = pcVar33;
                    pcVar52 = (char *)realloc(pcVar49,(size_t)pcVar33);
                    pVVar15->varr = pcVar52;
                    pVVar15->size = (size_t)pcVar33;
                  }
                  sVar54 = pVVar15->els_num;
                  pcVar52 = pVVar15->varr;
                  pVVar15->els_num = sVar54 + 1;
                  *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) = 0x22;
                  pVVar15 = c2m_ctx->temp_string;
                  pcVar49 = (c2m_ctx_t)pVVar15->varr;
                  if (pcVar49 != (c2m_ctx_t)0x0) {
                    uVar37 = pVVar15->els_num + 1;
                    if (pVVar15->size < uVar37) {
                      pcVar33 = (c2m_ctx_t)((uVar37 >> 1) + uVar37);
                      pcVar51 = pcVar33;
                      pcVar52 = (char *)realloc(pcVar49,(size_t)pcVar33);
                      pVVar15->varr = pcVar52;
                      pVVar15->size = (size_t)pcVar33;
                    }
                    sVar54 = pVVar15->els_num;
                    pcVar52 = pVVar15->varr;
                    pVVar15->els_num = sVar54 + 1;
                    *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) = 0;
                    if (c2m_ctx->temp_string != (VARR_char *)0x0) {
                      sVar60 = uniq_cstr(c2m_ctx,c2m_ctx->temp_string->varr);
                      pcVar25->env[0].__jmpbuf[3] = (long)sVar60.s;
                      set_string_val(c2m_ctx,(token_t)pcVar25,c2m_ctx->temp_string,0x20);
                      bVar59 = true;
                      goto LAB_00193440;
                    }
                    goto LAB_001935ef;
                  }
                  goto LAB_001935f9;
                }
                goto LAB_001935ea;
              }
              goto LAB_001935e5;
            }
            goto LAB_001935db;
          }
          iVar20 = *(int *)(in_RSI->env[0].__jmpbuf + 2);
          lVar24 = (long)iVar20;
          if (((((lVar24 < 2) ||
                (pcVar52 = *(char **)(p_Var5 + lVar24 * 8 + -0x10),
                *(short *)&((MIR_context_t)pcVar52)->gen_ctx != 0x142)) &&
               ((iVar20 < 3 ||
                ((**(short **)(p_Var5 + lVar24 * 8 + -0x10) != 0x20 ||
                 (pcVar52 = *(char **)(p_Var5 + lVar24 * 8 + -0x18),
                 *(short *)&((MIR_context_t)pcVar52)->gen_ctx != 0x142)))))) &&
              ((iVar23 <= iVar20 ||
               (pcVar52 = *(char **)(p_Var5 + lVar24 * 8),
               *(short *)&((MIR_context_t)pcVar52)->gen_ctx != 0x142)))) &&
             (((iVar23 <= iVar20 + 1 ||
               (pcVar52 = *(char **)(p_Var5 + (long)(iVar20 + 1) * 8),
               *(short *)&((MIR_context_t)pcVar52)->gen_ctx != 0x142)) ||
              (**(short **)(p_Var5 + lVar24 * 8) != 0x20)))) {
            pcVar52 = ((pos_t *)&pcVar25->options)->fname;
            pptVar6 = (token_t *)pcVar25->env[0].__jmpbuf[0];
            ptVar27 = (token_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)ptVar27 = 0x144;
            (ptVar27->pos).fname = pcVar52;
            *(token_t **)&(ptVar27->pos).lno = pptVar6;
            ptVar27->repr = "";
            ptVar27->node_code = N_IGNORE;
            ptVar27->node = (node_t_conflict)0x0;
            unget_next_pptoken(c2m_ctx,ptVar27);
            copy_and_push_back(c2m_ctx,(VARR_token_t *)pcVar51,*(pos_t *)&in_RSI->options);
            pcVar52 = ((pos_t *)&pcVar25->options)->fname;
            pptVar6 = (token_t *)pcVar25->env[0].__jmpbuf[0];
            ptVar27 = (token_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)ptVar27 = 0x143;
            (ptVar27->pos).fname = pcVar52;
            *(token_t **)&(ptVar27->pos).lno = pptVar6;
            ptVar27->repr = "";
            ptVar27->node_code = N_IGNORE;
            ptVar27->node = (node_t_conflict)0x0;
            unget_next_pptoken(c2m_ctx,ptVar27);
            return;
          }
          if (pcVar51 == (c2m_ctx_t)0x0) goto LAB_001935bd;
          if (pcVar51->ctx == (MIR_context_t)0x1) {
            pptVar6 = (token_t *)pcVar51->env[0].__jmpbuf[0];
            if (pptVar6 == (token_t *)0x0) goto LAB_001935cc;
            sVar1 = *(short *)*pptVar6;
            if ((sVar1 == 0x20) || (sVar1 == 10)) goto LAB_00192ee5;
          }
          else if (pcVar51->ctx == (MIR_context_t)0x0) {
LAB_00192ee5:
            pcVar52 = ((pos_t *)&pcVar25->options)->fname;
            pptVar6 = (token_t *)pcVar25->env[0].__jmpbuf[0];
            pcVar25 = (c2m_ctx_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)&pcVar25->ctx = 0x141;
            ((pos_t *)&pcVar25->options)->fname = pcVar52;
            pcVar25->env[0].__jmpbuf[0] = (long)pptVar6;
            pcVar25->env[0].__jmpbuf[3] = (long)"";
            *(undefined4 *)(pcVar25->env[0].__jmpbuf + 1) = 0;
            pcVar25->env[0].__jmpbuf[2] = 0;
            bVar59 = true;
            goto LAB_00193440;
          }
          pcVar49 = (c2m_ctx_t)in_RSI->env[0].__jmpbuf[3];
          add_tokens((VARR_token_t *)pcVar49,(VARR_token_t *)pcVar51);
        }
        else {
          if (sVar1 != 0x20) {
            if (sVar1 == 0x23) {
              puVar7 = (uint *)in_RSI->env[0].__jmpbuf[3];
              pcVar51 = pcVar25;
              if (puVar7 == (uint *)0x0) goto LAB_001935e0;
              uStack_6c = *puVar7;
            }
            else {
              uStack_6c = 0xffffffff;
            }
          }
          bVar59 = false;
LAB_00193440:
          if (!bVar59) {
            pcVar25 = (c2m_ctx_t)copy_token(c2m_ctx,(token_t)pcVar25,*(pos_t *)&in_RSI->options);
          }
          pcVar49 = (c2m_ctx_t)in_RSI->env[0].__jmpbuf[3];
          add_token((VARR_token_t *)pcVar49,(token_t)pcVar25);
        }
        iVar20 = *(int *)(in_RSI->env[0].__jmpbuf + 2);
      } while (iVar20 < iVar23);
    }
    ptVar27 = get_next_pptoken_1(c2m_ctx,0);
    unget_next_pptoken(c2m_ctx,ptVar27);
    pcVar52 = (ptVar27->pos).fname;
    iVar23 = (ptVar27->pos).lno;
    iVar20 = (ptVar27->pos).ln_pos;
    ptVar27 = (token_t)reg_malloc(c2m_ctx,0x30);
    *(undefined4 *)ptVar27 = 0x145;
    (ptVar27->pos).fname = pcVar52;
    (ptVar27->pos).lno = iVar23;
    (ptVar27->pos).ln_pos = iVar20;
    ptVar27->repr = "";
    ptVar27->node_code = N_IGNORE;
    ptVar27->node = (node_t_conflict)0x0;
    unget_next_pptoken(c2m_ctx,ptVar27);
    pVVar8 = (VARR_token_t *)in_RSI->env[0].__jmpbuf[3];
    do_concat(c2m_ctx,pVVar8);
    push_back(c2m_ctx,pVVar8);
    pMVar4->func_redef_permission_p = 1;
    return;
  }
LAB_001935d6:
  process_replacement_cold_20();
LAB_001935db:
  process_replacement_cold_17();
  pcVar51 = pcVar33;
LAB_001935e0:
  process_replacement_cold_1();
LAB_001935e5:
  process_replacement_cold_16();
LAB_001935ea:
  process_replacement_cold_15();
LAB_001935ef:
  process_replacement_cold_13();
  pcVar33 = pcVar51;
LAB_001935f4:
  pcVar51 = pcVar33;
  process_replacement_cold_18();
LAB_001935f9:
  process_replacement_cold_14();
  pcVar33 = pcVar51;
  pcVar51 = pcVar49;
LAB_001935fe:
  process_replacement_cold_4();
LAB_00193603:
  process_replacement_cold_5();
LAB_00193608:
  process_replacement_cold_6();
  ppVar9 = pcVar51->pre_ctx;
  while( true ) {
    ptVar27 = get_next_pptoken_1(pcVar51,0);
    sVar1 = *(short *)ptVar27;
    if (sVar1 != 0x145) break;
    pop_macro_call(pcVar51);
  }
  if ((sVar1 == 10) || (sVar1 == 0x20)) {
    t = get_next_pptoken_1(pcVar51,0);
    t_01 = ptVar27;
  }
  else {
    t_01 = (token_t)0x0;
    t = ptVar27;
  }
  if (*(short *)t != 0x28) {
    unget_next_pptoken(pcVar51,t);
    if (t_01 != (token_t)0x0) {
      unget_next_pptoken(pcVar51,t_01);
    }
    out_token(pcVar51,t_00);
    return;
  }
  pcVar49 = (c2m_ctx_t)(t_00->pos).fname;
  pmVar28 = new_macro_call((macro_t)pcVar33,t_00->pos);
  pmVar10 = pmVar28->macro;
  pMVar50 = (MIR_item_t)&DAT_00000018;
  pVVar29 = (VARR_token_arr_t *)malloc(0x18);
  if (pVVar29 == (VARR_token_arr_t *)0x0) {
LAB_00193c1e:
    mir_varr_error((char *)pMVar50);
  }
  pVVar29->els_num = 0;
  pVVar29->size = 0x10;
  ppVVar30 = (token_arr_t *)malloc(0x80);
  pVVar29->varr = ppVVar30;
  pMVar50 = (MIR_item_t)&DAT_00000018;
  pgVar31 = (gen_ctx *)malloc(0x18);
  if (pgVar31 == (gen_ctx *)0x0) goto LAB_00193c1e;
  pgVar31->ctx = (MIR_context_t)0x0;
  ((pos_t *)&pgVar31->optimize_level)->fname = (char *)0x10;
  pMVar50 = (MIR_item_t)0x80;
  pMVar32 = (MIR_item_t)malloc(0x80);
  pgVar31->curr_func_item = pMVar32;
  pVVar8 = pmVar10->params;
  if (pVVar8 == (VARR_token_t *)0x0) {
LAB_00193c37:
    try_param_macro_call_cold_17();
LAB_00193c3c:
    try_param_macro_call_cold_15();
    goto LAB_00193c41;
  }
  uVar37 = pVVar8->els_num;
  uVar48 = 0;
  uVar21 = 0;
  if (uVar37 != 1) {
LAB_00193740:
    bVar59 = false;
    do {
      pcVar49 = (c2m_ctx_t)0x0;
      pcVar33 = (c2m_ctx_t)get_next_pptoken_1(pcVar51,0);
      if (*(short *)&pcVar33->ctx == 0x145) {
        pcVar49 = (c2m_ctx_t)0x0;
        pcVar33 = (c2m_ctx_t)get_next_pptoken_1(pcVar51,0);
        pop_macro_call(pcVar51);
      }
      uVar22 = *(uint *)&pcVar33->ctx & 0xffff;
      uVar45 = *(uint *)&pcVar33->ctx * 0x10000;
      pcVar52 = (char *)(ulong)uVar45;
      uVar47 = uVar45 + 0xfec30000 >> 0x10;
      if ((((uVar47 < 0xb) && (pcVar49 = (c2m_ctx_t)0x5c1, (0x5c1U >> (uVar47 & 0x1f) & 1) != 0)) ||
          (pcVar52 = (char *)(ulong)CONCAT31((int3)(uVar45 >> 8),uVar45 == 0x230000),
          (bool)(bVar59 & uVar45 == 0x230000))) ||
         (uVar45 = uVar22 ^ 0x29 | uVar48, pcVar52 = (char *)(ulong)uVar45, uVar45 == 0)) {
        if (uVar22 != 0x29) {
          in_R8 = (char **)pmVar10->id->repr;
          pcVar52 = "unfinished call of macro %s";
          error(pcVar51,0x1c3620,(char *)pcVar33->options,pcVar33->env[0].__jmpbuf[0]);
          pcVar49 = pcVar33;
          unget_next_pptoken(pcVar51,(token_t)pcVar33);
        }
        pMVar50 = (MIR_item_t)pVVar29->varr;
        if (pMVar50 == (MIR_item_t)0x0) goto LAB_00193c3c;
        uVar34 = pVVar29->els_num + 1;
        if (pVVar29->size < uVar34) {
          sVar54 = (uVar34 >> 1) + uVar34;
          pcVar49 = (c2m_ctx_t)(sVar54 * 8);
          ppVVar30 = (token_arr_t *)realloc(pMVar50,(size_t)pcVar49);
          pVVar29->varr = ppVVar30;
          pVVar29->size = sVar54;
        }
        uVar12 = pVVar29->els_num;
        uVar34 = uVar12 + 1;
        pVVar29->els_num = uVar34;
        pVVar29->varr[uVar12] = (token_arr_t)pgVar31;
        pcVar52 = (char *)(uVar12 | uVar37);
        if ((MIR_context_t)pcVar52 == (MIR_context_t)0x0) {
          pcVar52 = (char *)pVVar29->varr;
          if ((MIR_context_t)pcVar52 == (MIR_context_t)0x0) goto LAB_00193c55;
          pgVar31 = ((MIR_context_t)pcVar52)->gen_ctx;
          if (pgVar31 == (gen_ctx *)0x0) goto LAB_00193c5a;
          pcVar49 = (c2m_ctx_t)pgVar31->ctx;
          if (pcVar49 == (c2m_ctx_t)0x0) {
LAB_00193b7d:
            pVVar29->els_num = uVar12;
            pgVar31 = (&((MIR_context_t)pcVar52)->gen_ctx)[uVar12];
            if ((pgVar31 == (gen_ctx *)0x0) ||
               (pMVar50 = pgVar31->curr_func_item, pMVar50 == (MIR_item_t)0x0)) goto LAB_00193c5f;
            free(pMVar50);
            free(pgVar31);
            goto LAB_00193ba7;
          }
          if (pcVar49 == (c2m_ctx_t)&DAT_00000001) {
            if (pgVar31->curr_func_item == (MIR_item_t)0x0) goto LAB_00193c69;
            if (*pgVar31->curr_func_item->data == 0x20) goto LAB_00193b7d;
          }
        }
        if (uVar34 <= uVar37) {
          if (uVar37 <= uVar34) goto LAB_00193ba7;
          pMStack_e0 = (MIR_context_t)0x1c365f;
          goto LAB_00193a8a;
        }
        if (pVVar29->varr == (token_arr_t *)0x0) goto LAB_00193c4b;
        pVVar13 = pVVar29->varr[uVar37];
        if (pVVar13 == (token_arr_t)0x0) goto LAB_00193c50;
        if (pVVar13->els_num != 0) {
          if (pVVar13->varr == (token_t *)0x0) goto LAB_00193c64;
          pcVar33 = (c2m_ctx_t)*pVVar13->varr;
        }
        pMStack_e0 = (MIR_context_t)0x1c363c;
        goto LAB_00193a2f;
      }
      pcVar52 = (char *)(ulong)(uVar48 | uVar21);
      if (uVar22 == 0x2c && (uVar48 | uVar21) == 0) {
        pMVar50 = (MIR_item_t)pVVar29->varr;
        if (pMVar50 == (MIR_item_t)0x0) goto LAB_00193c32;
        uVar34 = pVVar29->els_num + 1;
        if (pVVar29->size < uVar34) {
          sVar54 = (uVar34 >> 1) + uVar34;
          pcVar49 = (c2m_ctx_t)(sVar54 * 8);
          ppVVar30 = (token_arr_t *)realloc(pMVar50,(size_t)pcVar49);
          pVVar29->varr = ppVVar30;
          pVVar29->size = sVar54;
        }
        sVar11 = pVVar29->els_num;
        pcVar52 = (char *)pVVar29->varr;
        sVar54 = sVar11 + 1;
        pVVar29->els_num = sVar54;
        (&((MIR_context_t)pcVar52)->gen_ctx)[sVar11] = pgVar31;
        pMVar50 = (MIR_item_t)&DAT_00000018;
        pgVar31 = (gen_ctx *)malloc(0x18);
        if (pgVar31 == (gen_ctx *)0x0) goto LAB_00193c1e;
        pgVar31->ctx = (MIR_context_t)0x0;
        ((pos_t *)&pgVar31->optimize_level)->fname = (char *)0x10;
        pMVar50 = (MIR_item_t)0x80;
        pMVar32 = (MIR_item_t)malloc(0x80);
        pgVar31->curr_func_item = pMVar32;
        uVar48 = 0;
        if (sVar54 == uVar37 - 1) {
          pVVar8 = pmVar10->params;
          if (((pVVar8 == (VARR_token_t *)0x0) ||
              (pcVar52 = (char *)pVVar8->varr, (MIR_context_t)pcVar52 == (MIR_context_t)0x0)) ||
             (pVVar8->els_num <= uVar37 - 1)) goto LAB_00193c28;
          iVar23 = strcmp(*(char **)(*(long *)((long)pcVar52 + uVar37 * 8 + -8) + 0x28),"...");
          uVar21 = (uint)(iVar23 == 0);
        }
        else {
          uVar21 = 0;
        }
      }
      else {
        pMVar50 = pgVar31->curr_func_item;
        if (pMVar50 == (MIR_item_t)0x0) goto LAB_00193c2d;
        pcVar52 = (char *)((long)&pgVar31->ctx->gen_ctx + 1);
        if (((pos_t *)&pgVar31->optimize_level)->fname < pcVar52) {
          pMVar50 = (MIR_item_t)realloc(pMVar50,(long)(pcVar52 + ((ulong)pcVar52 >> 1)) * 8);
          pgVar31->curr_func_item = pMVar50;
          ((pos_t *)&pgVar31->optimize_level)->fname = pcVar52 + ((ulong)pcVar52 >> 1);
        }
        pMVar4 = pgVar31->ctx;
        pgVar31->ctx = (MIR_context_t)((long)&pMVar4->gen_ctx + 1);
        (&pgVar31->curr_func_item->data)[(long)pMVar4] = pcVar33;
        if (*(short *)&pcVar33->ctx == 0x28) {
          uVar48 = uVar48 + 1;
        }
        else if (*(short *)&pcVar33->ctx == 0x29) {
          uVar48 = uVar48 - 1;
        }
      }
      bVar59 = *(short *)&pcVar33->ctx == 10;
    } while( true );
  }
  if (pVVar8->varr != (token_t *)0x0) {
    uVar21 = (uint)(*(short *)*pVVar8->varr == 0x10f);
    goto LAB_00193740;
  }
  goto LAB_00193c46;
LAB_00193a8a:
  pMVar50 = (MIR_item_t)&DAT_00000018;
  pgVar31 = (gen_ctx *)malloc(0x18);
  if (pgVar31 != (gen_ctx *)0x0) {
    pgVar31->ctx = (MIR_context_t)0x0;
    ((pos_t *)&pgVar31->optimize_level)->fname = (char *)0x10;
    pMVar50 = (MIR_item_t)malloc(0x80);
    pgVar31->curr_func_item = pMVar50;
    pMVar50 = (MIR_item_t)pVVar29->varr;
    if (pMVar50 != (MIR_item_t)0x0) goto code_r0x00193aca;
    try_param_macro_call_cold_6();
LAB_00193c28:
    try_param_macro_call_cold_2();
LAB_00193c2d:
    try_param_macro_call_cold_1();
LAB_00193c32:
    try_param_macro_call_cold_3();
    goto LAB_00193c37;
  }
  goto LAB_00193c1e;
code_r0x00193aca:
  uVar34 = uVar34 + 1;
  if (pVVar29->size < uVar34) {
    sVar54 = (uVar34 >> 1) + uVar34;
    pcVar49 = (c2m_ctx_t)(sVar54 * 8);
    ppVVar30 = (token_arr_t *)realloc(pMVar50,(size_t)pcVar49);
    pVVar29->varr = ppVVar30;
    pVVar29->size = sVar54;
  }
  sVar54 = pVVar29->els_num;
  pcVar52 = (char *)pVVar29->varr;
  uVar34 = sVar54 + 1;
  pVVar29->els_num = uVar34;
  (&((MIR_context_t)pcVar52)->gen_ctx)[sVar54] = pgVar31;
  if (uVar37 <= uVar34) goto LAB_00193b11;
  goto LAB_00193a8a;
  while( true ) {
    ppgVar18 = &pMVar53->gen_ctx;
    pMVar53 = (MIR_context_t)((long)&pMVar53->gen_ctx + 1);
    if (pptVar6[(long)((long)ppgVar18 + 1)]->node_code == N_GT) break;
LAB_00193d8d:
    pcVar25 = (c2m_ctx_t)((long)pcVar51->env[0].__jmpbuf + (long)&pMVar53[-1].setjmp_addr);
    if (pcVar25 == (c2m_ctx_t)&DAT_00000001) goto LAB_0019413a;
  }
  pcVar25 = (c2m_ctx_t)
            CONCAT71((int7)((ulong)pptVar6[(long)((long)ppgVar18 + 1)] >> 8),pMVar53 < pMVar4);
LAB_00193db0:
  if ((char)pcVar25 == '\0') goto LAB_0019413a;
  pVVar15 = pcVar33->symbol_text;
  if ((pVVar15 == (VARR_char *)0x0) ||
     (pcVar51 = (c2m_ctx_t)pVVar15->varr, pcVar51 == (c2m_ctx_t)0x0)) goto LAB_001941ef;
  pVVar15->els_num = 0;
  pVVar16 = pcVar33->temp_string;
  if ((pVVar16 == (VARR_char *)0x0) || (pVVar16->varr == (char *)0x0)) goto LAB_001941f4;
  pVVar16->els_num = 0;
  uVar37 = pVVar15->els_num + 1;
  if (pVVar15->size < uVar37) {
    pcVar55 = (c2m_ctx_t)((uVar37 >> 1) + uVar37);
    pcVar25 = pcVar55;
    pcVar38 = (char *)realloc(pcVar51,(size_t)pcVar55);
    pVVar15->varr = pcVar38;
    pVVar15->size = (size_t)pcVar55;
  }
  sVar54 = pVVar15->els_num;
  pVVar15->els_num = sVar54 + 1;
  pVVar15->varr[sVar54] = '<';
  if (pMVar56 < pMVar53) {
    do {
      lVar24 = pcVar49->env[0].__jmpbuf[0];
      if ((lVar24 == 0) || (pcVar49->ctx <= pMVar56)) goto LAB_001941ea;
      pcVar38 = *(char **)(*(long *)(lVar24 + (long)pMVar56 * 8) + 0x28);
      cVar19 = *pcVar38;
      while (cVar19 != '\0') {
        pVVar15 = pcVar33->symbol_text;
        pcVar51 = (c2m_ctx_t)pVVar15->varr;
        if (pcVar51 == (c2m_ctx_t)0x0) {
LAB_001941d1:
          get_header_name_cold_2();
          goto LAB_001941d6;
        }
        uVar37 = pVVar15->els_num + 1;
        if (pVVar15->size < uVar37) {
          pcVar55 = (c2m_ctx_t)((uVar37 >> 1) + uVar37);
          pcVar25 = pcVar55;
          pcVar39 = (char *)realloc(pcVar51,(size_t)pcVar55);
          pVVar15->varr = pcVar39;
          pVVar15->size = (size_t)pcVar55;
        }
        sVar54 = pVVar15->els_num;
        pVVar15->els_num = sVar54 + 1;
        pVVar15->varr[sVar54] = cVar19;
        pVVar15 = pcVar33->temp_string;
        pcVar51 = (c2m_ctx_t)pVVar15->varr;
        if (pcVar51 == (c2m_ctx_t)0x0) {
          get_header_name_cold_1();
          goto LAB_001941d1;
        }
        cVar19 = *pcVar38;
        uVar37 = pVVar15->els_num + 1;
        if (pVVar15->size < uVar37) {
          pcVar55 = (c2m_ctx_t)((uVar37 >> 1) + uVar37);
          pcVar25 = pcVar55;
          pcVar39 = (char *)realloc(pcVar51,(size_t)pcVar55);
          pVVar15->varr = pcVar39;
          pVVar15->size = (size_t)pcVar55;
        }
        sVar54 = pVVar15->els_num;
        pVVar15->els_num = sVar54 + 1;
        pVVar15->varr[sVar54] = cVar19;
        cVar19 = pcVar38[1];
        pcVar38 = pcVar38 + 1;
      }
      pMVar56 = (MIR_context_t)((long)&pMVar56->gen_ctx + 1);
    } while (pMVar56 != pMVar53);
  }
  pVVar15 = pcVar33->symbol_text;
  pcVar51 = (c2m_ctx_t)pVVar15->varr;
  if (pcVar51 == (c2m_ctx_t)0x0) goto LAB_001941fe;
  uVar37 = pVVar15->els_num + 1;
  if (pVVar15->size < uVar37) {
    pcVar55 = (c2m_ctx_t)((uVar37 >> 1) + uVar37);
    pcVar25 = pcVar55;
    pcVar38 = (char *)realloc(pcVar51,(size_t)pcVar55);
    pVVar15->varr = pcVar38;
    pVVar15->size = (size_t)pcVar55;
  }
  sVar54 = pVVar15->els_num;
  pVVar15->els_num = sVar54 + 1;
  pVVar15->varr[sVar54] = '>';
  pVVar15 = pcVar33->symbol_text;
  pcVar51 = (c2m_ctx_t)pVVar15->varr;
  if (pcVar51 == (c2m_ctx_t)0x0) goto LAB_00194203;
  uVar37 = pVVar15->els_num + 1;
  if (pVVar15->size < uVar37) {
    pcVar55 = (c2m_ctx_t)((uVar37 >> 1) + uVar37);
    pcVar25 = pcVar55;
    pcVar38 = (char *)realloc(pcVar51,(size_t)pcVar55);
    pVVar15->varr = pcVar38;
    pVVar15->size = (size_t)pcVar55;
  }
  sVar54 = pVVar15->els_num;
  pVVar15->els_num = sVar54 + 1;
  pVVar15->varr[sVar54] = '\0';
  pVVar15 = pcVar33->temp_string;
  pcVar51 = (c2m_ctx_t)pVVar15->varr;
  if (pcVar51 == (c2m_ctx_t)0x0) goto LAB_00194208;
  uVar37 = pVVar15->els_num + 1;
  if (pVVar15->size < uVar37) {
    sVar57 = (uVar37 >> 1) + uVar37;
    pcVar38 = (char *)realloc(pcVar51,sVar57);
    pVVar15->varr = pcVar38;
    pVVar15->size = sVar57;
  }
  sVar54 = pVVar15->els_num;
  pVVar15->els_num = sVar54 + 1;
  pVVar15->varr[sVar54] = '\0';
  pcVar25 = (c2m_ctx_t)((ulong)pMVar26 & 0xffffffff);
  pcVar51 = pcVar49;
  del_tokens((VARR_token_t *)pcVar49,(int)pMVar26,(int)pMVar53 - (int)pMVar26);
  if (pcVar33->symbol_text != (VARR_char *)0x0) {
    if (pcVar33->temp_string == (VARR_char *)0x0) goto LAB_00194212;
    pcVar38 = pcVar33->symbol_text->varr;
    sVar60 = uniq_cstr(pcVar33,pcVar33->temp_string->varr);
    pnVar40 = new_node(pcVar33,N_STR);
    add_pos(pcVar33,pnVar40,pVar17);
    pcStack_178 = sVar60.s;
    (pnVar40->u).l = (mir_long)pcStack_178;
    sStack_170 = sVar60.len;
    (pnVar40->u).s.len = sStack_170;
    sVar60 = uniq_cstr(pcVar33,pcVar38);
    pcVar25 = (c2m_ctx_t)0x30;
    pcVar51 = pcVar33;
    puVar41 = (undefined4 *)reg_malloc(pcVar33,0x30);
    *puVar41 = 0x13e;
    *(char **)(puVar41 + 2) = pcVar58;
    *(token_t **)(puVar41 + 4) = pptVar14;
    *(char **)(puVar41 + 10) = sVar60.s;
    puVar41[6] = 0;
    *(node_t_conflict *)(puVar41 + 8) = pnVar40;
    lVar24 = pcVar49->env[0].__jmpbuf[0];
    if ((lVar24 != 0) && (pMVar26 < pcVar49->ctx)) {
      *(undefined4 **)(lVar24 + (long)pMVar26 * 8) = puVar41;
      goto LAB_0019413a;
    }
    goto LAB_001941f9;
  }
  goto LAB_0019420d;
  while( true ) {
    pVVar29->els_num = uVar34 - 1;
    pMVar32 = (MIR_item_t)pVVar29->varr[uVar34 - 1];
    if ((pMVar32 == (MIR_item_t)0x0) ||
       (pMVar50 = (pMVar32->item_link).prev, pMVar50 == (MIR_item_t)0x0)) {
      try_param_macro_call_cold_9();
      goto LAB_00193c19;
    }
    free(pMVar50);
    free(pMVar32);
    uVar34 = pVVar29->els_num;
    pMVar50 = pMVar32;
    if (uVar34 <= uVar37) break;
LAB_00193a2f:
    if (pVVar29->varr == (token_arr_t *)0x0) {
LAB_00193c19:
      try_param_macro_call_cold_10();
      goto LAB_00193c1e;
    }
  }
LAB_00193b11:
  in_R8 = (char **)pmVar10->id->repr;
  pcVar49 = (c2m_ctx_t)((pos_t *)&pcVar33->options)->fname;
  error(pcVar51,pMStack_e0,(char *)pcVar49,pcVar33->env[0].__jmpbuf[0]);
  pcVar52 = (char *)pMStack_e0;
LAB_00193ba7:
  pmVar28->args = pVVar29;
  pVVar3 = ppVar9->macro_call_stack;
  pMVar50 = (MIR_item_t)pVVar3->varr;
  if (pMVar50 != (MIR_item_t)0x0) {
    uVar37 = pVVar3->els_num + 1;
    if (pVVar3->size < uVar37) {
      sVar54 = (uVar37 >> 1) + uVar37;
      ppmVar35 = (macro_call_t *)realloc(pMVar50,sVar54 * 8);
      pVVar3->varr = ppmVar35;
      pVVar3->size = sVar54;
    }
    sVar54 = pVVar3->els_num;
    pVVar3->els_num = sVar54 + 1;
    pVVar3->varr[sVar54] = pmVar28;
    return;
  }
LAB_00193c41:
  try_param_macro_call_cold_8();
LAB_00193c46:
  try_param_macro_call_cold_16();
LAB_00193c4b:
  try_param_macro_call_cold_12();
LAB_00193c50:
  try_param_macro_call_cold_11();
LAB_00193c55:
  try_param_macro_call_cold_14();
LAB_00193c5a:
  try_param_macro_call_cold_13();
LAB_00193c5f:
  try_param_macro_call_cold_5();
LAB_00193c64:
  try_param_macro_call_cold_7();
LAB_00193c69:
  try_param_macro_call_cold_4();
  pMVar50 = pMVar50[5].item_link.prev;
  pcVar33 = (c2m_ctx_t)(pMVar50->item_link).prev;
  if (pcVar33 != (c2m_ctx_t)0x0) {
    puVar36 = &((token_t)pMVar50->data)->field_0x1;
    if (pMVar50->module < puVar36) {
      pMVar32 = (MIR_item_t)realloc(pcVar33,(long)(puVar36 + ((ulong)puVar36 >> 1)) * 8);
      (pMVar50->item_link).prev = pMVar32;
      pMVar50->module = (MIR_module_t)(puVar36 + ((ulong)puVar36 >> 1));
    }
    ptVar27 = (token_t)pMVar50->data;
    pMVar50->data = &ptVar27->field_0x1;
    (&((pMVar50->item_link).prev)->data)[(long)ptVar27] = pcVar49;
    return;
  }
  unget_next_pptoken_cold_1();
  if (((pcVar33 != (c2m_ctx_t)0x0) && (pcVar33->env[0].__jmpbuf[0] != 0)) &&
     (pcVar52 = (char *)pcVar33->ctx, (MIR_context_t)pcVar52 != (MIR_context_t)0x0)) {
    return;
  }
  VARR_token_arr_tlast_cold_1();
  *in_R8 = (char *)0x0;
  pcVar25 = pcVar49;
  pcVar51 = pcVar33;
  if (pcVar49 == (c2m_ctx_t)0x0) {
LAB_001941d6:
    get_header_name_cold_15();
LAB_001941db:
    get_header_name_cold_12();
LAB_001941e0:
    get_header_name_cold_13();
  }
  else {
    pMVar4 = pcVar49->ctx;
    if (pMVar4 != (MIR_context_t)0x0) {
      pptVar6 = (token_t *)pcVar49->env[0].__jmpbuf[0];
      if (pptVar6 == (token_t *)0x0) goto LAB_001941db;
      pMVar26 = (MIR_context_t)0x0;
      do {
        pcVar51 = (c2m_ctx_t)pptVar6[(long)pMVar26];
        if (*(short *)&pcVar51->ctx != 0x20) {
          if ((pMVar26 < pMVar4) && (*(int *)(pcVar51->env[0].__jmpbuf + 1) == 0x17)) {
            pMVar56 = (MIR_context_t)((long)&pMVar26->gen_ctx + 1);
            pcVar25 = (c2m_ctx_t)CONCAT71((int7)((ulong)pcVar49 >> 8),pMVar56 < pMVar4);
            if (pMVar56 < pMVar4) {
              pcVar58 = ((pos_t *)&pcVar51->options)->fname;
              pptVar14 = (token_t *)pcVar51->env[0].__jmpbuf[0];
              pVar17 = *(pos_t *)&pcVar51->options;
              pcVar51 = (c2m_ctx_t)pptVar6[(long)((long)&pMVar26->gen_ctx + 1)];
              pMVar53 = pMVar56;
              if (*(int *)(pcVar51->env[0].__jmpbuf + 1) == 0x19) goto LAB_00193db0;
              pcVar51 = (c2m_ctx_t)(2 - (long)pMVar4);
              goto LAB_00193d8d;
            }
          }
          break;
        }
        pMVar26 = (MIR_context_t)((long)&pMVar26->gen_ctx + 1);
      } while (pMVar4 != pMVar26);
    }
LAB_0019413a:
    pcVar55 = (c2m_ctx_t)pcVar49->ctx;
    if (pcVar55 == (c2m_ctx_t)0x0) {
      pcVar46 = (c2m_ctx_t)0x0;
    }
    else {
      puVar43 = (undefined8 *)pcVar49->env[0].__jmpbuf[0];
      if (puVar43 == (undefined8 *)0x0) goto LAB_001941e0;
      pcVar46 = (c2m_ctx_t)(ulong)(*(short *)*puVar43 == 0x20);
    }
    pcVar25 = (c2m_ctx_t)((long)&pcVar55[-1].gen_ctx + 7);
    if (pcVar46 != pcVar25) {
LAB_001941a4:
      error(pcVar33,0x1c3085,format,pcVar52);
      return;
    }
    if ((pcVar46 < pcVar55) && (lVar24 = pcVar49->env[0].__jmpbuf[0], lVar24 != 0)) {
      ptVar27 = *(token_t *)(lVar24 + (long)pcVar46 * 8);
      sVar1 = *(short *)ptVar27;
      if ((sVar1 == 0x102) || (sVar1 == 0x13e)) {
        get_include_fname(pcVar33,ptVar27,in_R8);
        return;
      }
      goto LAB_001941a4;
    }
  }
  get_header_name_cold_14();
LAB_001941ea:
  get_header_name_cold_9();
LAB_001941ef:
  get_header_name_cold_11();
LAB_001941f4:
  get_header_name_cold_10();
LAB_001941f9:
  get_header_name_cold_3();
LAB_001941fe:
  get_header_name_cold_8();
LAB_00194203:
  get_header_name_cold_7();
LAB_00194208:
  get_header_name_cold_6();
LAB_0019420d:
  get_header_name_cold_5();
LAB_00194212:
  get_header_name_cold_4();
  plVar42 = (long *)malloc(0x30);
  *plVar42 = (long)pcVar51;
  plVar42[1] = (long)pcVar25;
  plVar42[2] = extraout_RDX;
  *(undefined4 *)(plVar42 + 4) = 0;
  plVar42[3] = 0;
  pcVar52 = &DAT_00000018;
  puVar43 = (undefined8 *)malloc(0x18);
  plVar42[5] = (long)puVar43;
  if (puVar43 == (undefined8 *)0x0) {
    mir_varr_error(pcVar52);
  }
  *puVar43 = 0;
  puVar43[1] = 0x40;
  pvVar44 = malloc(0x200);
  puVar43[2] = pvVar44;
  return;
}

Assistant:

static void pop_macro_call (c2m_ctx_t c2m_ctx) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  macro_call_t mc;

  mc = VARR_POP (macro_call_t, macro_call_stack);
#ifdef C2MIR_PREPRO_DEBUG
  fprintf (stderr, "finish call of macro %s\n", mc->macro->id->repr);
#endif
  mc->macro->ignore_p = FALSE;
  free_macro_call (mc);
}